

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O2

int __thiscall CConsoleNetConnection::Recv(CConsoleNetConnection *this,char *pLine,int MaxLength)

{
  char *dest;
  char *source;
  long lVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint size;
  long lVar8;
  
  if (this->m_State != 4) {
    return 0;
  }
  iVar4 = this->m_BufferOffset;
  lVar6 = (long)iVar4;
  if (lVar6 == 0) {
    return 0;
  }
  dest = this->m_aBuffer;
  bVar3 = this->m_LineEndingDetected;
  lVar7 = 0;
  do {
    source = dest + lVar7;
    cVar2 = dest[lVar7];
    if ((cVar2 != '\n') && (cVar2 != '\r')) {
      lVar8 = 0;
      goto LAB_001b9a5e;
    }
    if ((bVar3 & 1) == 0) {
      this->m_aLineEnding[0] = cVar2;
      if ((lVar7 + 1 < lVar6) &&
         (((cVar2 = dest[lVar7 + 1], cVar2 == '\r' || (cVar2 == '\n')) && (*source != cVar2)))) {
        this->m_aLineEnding[1] = cVar2;
      }
      this->m_LineEndingDetected = true;
      bVar3 = 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 < lVar6);
  iVar5 = 0;
  goto LAB_001b9a3c;
  while (lVar1 = lVar8 + lVar7, lVar8 = lVar8 + 1, lVar1 + 1 < lVar6) {
LAB_001b9a5e:
    iVar5 = (int)lVar7;
    if ((this->m_aBuffer[lVar8 + lVar7] == '\n') || (this->m_aBuffer[lVar8 + lVar7] == '\r')) {
      size = (uint)lVar8;
      if ((int)size < MaxLength) {
        mem_copy(pLine,source,size);
        pLine[(int)size] = '\0';
        str_sanitize_cc(pLine);
        mem_move(dest,this->m_aBuffer + lVar8 + lVar7,(this->m_BufferOffset - iVar5) - size);
        iVar5 = (this->m_BufferOffset - iVar5) - size;
        iVar4 = 1;
        goto LAB_001b9a3e;
      }
      break;
    }
  }
  if (lVar7 == 0) {
    return 0;
  }
  mem_move(dest,source,iVar4 - iVar5);
  iVar5 = this->m_BufferOffset - iVar5;
LAB_001b9a3c:
  iVar4 = 0;
LAB_001b9a3e:
  this->m_BufferOffset = iVar5;
  return iVar4;
}

Assistant:

int CConsoleNetConnection::Recv(char *pLine, int MaxLength)
{
	if(State() == NET_CONNSTATE_ONLINE)
	{
		if(m_BufferOffset)
		{
			// find message start
			int StartOffset = 0;
			while(m_aBuffer[StartOffset] == '\r' || m_aBuffer[StartOffset] == '\n')
			{
				// detect clients line ending format
				if(!m_LineEndingDetected)
				{
					m_aLineEnding[0] = m_aBuffer[StartOffset];
					if(StartOffset+1 < m_BufferOffset && (m_aBuffer[StartOffset+1] == '\r' || m_aBuffer[StartOffset+1] == '\n') &&
						m_aBuffer[StartOffset] != m_aBuffer[StartOffset+1])
						m_aLineEnding[1] = m_aBuffer[StartOffset+1];
					m_LineEndingDetected = true;
				}

				if(++StartOffset >= m_BufferOffset)
				{
					m_BufferOffset = 0;
					return 0;
				}
			}

			// find message end
			int EndOffset = StartOffset;
			while(m_aBuffer[EndOffset] != '\r' && m_aBuffer[EndOffset] != '\n')
			{
				if(++EndOffset >= m_BufferOffset)
				{
					if(StartOffset > 0)
					{
						mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
						m_BufferOffset -= StartOffset;
					}
					return 0;
				}
			}

			// extract message and update buffer
			if(MaxLength-1 < EndOffset-StartOffset)
			{
				if(StartOffset > 0)
				{
					mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
					m_BufferOffset -= StartOffset;
				}
				return 0;
			}
			mem_copy(pLine, m_aBuffer+StartOffset, EndOffset-StartOffset);
			pLine[EndOffset-StartOffset] = 0;
			str_sanitize_cc(pLine);
			mem_move(m_aBuffer, m_aBuffer+EndOffset, m_BufferOffset-EndOffset);
			m_BufferOffset -= EndOffset;
			return 1;
		}
	}
	return 0;
}